

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrPrint.c
# Opt level: O0

int Rwr_GetBushSumOfVolumes(Rwr_Man_t *p,int Entry)

{
  int local_28;
  int local_24;
  int VolumeTotal;
  int Volume;
  Rwr_Node_t *pNode;
  Rwr_Man_t *pRStack_10;
  int Entry_local;
  Rwr_Man_t *p_local;
  
  local_28 = 0;
  pNode._4_4_ = Entry;
  pRStack_10 = p;
  for (_VolumeTotal = p->pTable[Entry]; _VolumeTotal != (Rwr_Node_t *)0x0;
      _VolumeTotal = _VolumeTotal->pNext) {
    if ((*(uint *)&_VolumeTotal->field_0xe & 0xffff) ==
        (uint)pRStack_10->puCanons[*(uint *)&_VolumeTotal->field_0xe & 0xffff]) {
      local_24 = 0;
      Rwr_ManIncTravId(pRStack_10);
      Rwr_Trav2_rec(pRStack_10,_VolumeTotal,&local_24);
      local_28 = local_24 + local_28;
    }
  }
  return local_28;
}

Assistant:

int Rwr_GetBushSumOfVolumes( Rwr_Man_t * p, int Entry )
{
    Rwr_Node_t * pNode;
    int Volume, VolumeTotal = 0;
    for ( pNode = p->pTable[Entry]; pNode; pNode = pNode->pNext )
    {
        if ( pNode->uTruth != p->puCanons[pNode->uTruth] )
            continue;
        Volume = 0;
        Rwr_ManIncTravId( p );
        Rwr_Trav2_rec( p, pNode, &Volume );
        VolumeTotal += Volume;
    }
    return VolumeTotal;
}